

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O1

void __thiscall
Disa::Matrix_Sparse::Matrix_Sparse
          (Matrix_Sparse *this,initializer_list<unsigned_long> non_zero,
          initializer_list<unsigned_long> index,initializer_list<double> value,size_t column)

{
  double dVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  __impl **pp_Var5;
  size_type __val;
  pointer __last;
  __impl *p_Var6;
  pointer puVar7;
  unsigned_long uVar8;
  ulong uVar9;
  source_location *psVar10;
  ostream *poVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  pointer puVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  source_location *psVar15;
  size_type sVar16;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __i;
  long lVar17;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last_00;
  source_location *psVar18;
  unsigned_long uVar19;
  unsigned_long *puVar20;
  pointer pdVar21;
  string *this_00;
  long lVar22;
  pointer pdVar23;
  size_type __new_size;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bevanwsjones[P]Disa_src_core_matrix_sparse_cpp:60:51)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bevanwsjones[P]Disa_src_core_matrix_sparse_cpp:60:51)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bevanwsjones[P]Disa_src_core_matrix_sparse_cpp:60:51)>
  __comp_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> org_index;
  vector<double,_std::allocator<double>_> new_value;
  size_type local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  vector<double,_std::allocator<double>_> local_e8;
  vector<double,_std::allocator<double>_> *local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  string local_58;
  undefined **local_38;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->row_non_zero,non_zero,(allocator_type *)&local_1c8);
  local_c0 = &this->column_index;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (local_c0,index,(allocator_type *)&local_1c8);
  local_c8 = &this->element_value;
  pbVar12 = &local_1c8;
  std::vector<double,_std::allocator<double>_>::vector(local_c8,value,(allocator_type *)pbVar12);
  this->column_size = column;
  psVar10 = (source_location *)
            (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (psVar10->_M_impl == (__impl *)0x0) {
    psVar15 = (source_location *)
              (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    p_Var6 = (__impl *)
             ((long)(this->column_index).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->column_index).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3);
    if (psVar15[-1]._M_impl != p_Var6) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
      local_1a8._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_0015dc18;
      console_format_abi_cxx11_(&local_1c8,(Disa *)0x0,(Log_Level)&local_1a8,psVar15);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,local_1c8._M_dataplus._M_p,
                           local_1c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,"Number of non-zeros does not match number of column non zeros",0x3d);
      std::endl<char,std::char_traits<char>>(poVar11);
      goto LAB_0013ce97;
    }
    psVar18 = psVar15;
    if (psVar10 != psVar15) {
      do {
        psVar18 = psVar10 + 1;
        if (psVar18 == psVar15) break;
        pp_Var5 = &psVar10->_M_impl;
        psVar10 = psVar18;
      } while (*pp_Var5 <= psVar18->_M_impl);
    }
    if (psVar18 != psVar15) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
      local_1a8._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_0015dc30;
      console_format_abi_cxx11_(&local_1c8,(Disa *)0x0,(Log_Level)&local_1a8,psVar15);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,local_1c8._M_dataplus._M_p,
                           local_1c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,"Inconsistent non-zeros list, but be ascending.",0x2e);
      std::endl<char,std::char_traits<char>>(poVar11);
      goto LAB_0013ce97;
    }
    if (p_Var6 == (__impl *)value._M_len) {
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (double *)0x0;
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (double *)0x0;
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d0 = 0;
      puVar7 = (this->row_non_zero).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)(this->row_non_zero).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar7 != 8) {
        do {
          uVar2 = puVar7[local_1d0];
          uVar3 = puVar7[local_1d0 + 1];
          __new_size = uVar3 - uVar2;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&local_128,__new_size);
          std::vector<double,_std::allocator<double>_>::resize(&local_e8,__new_size);
          __last = local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          puVar7 = local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            uVar8 = 0;
            puVar13 = local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              *puVar13 = uVar8;
              uVar8 = uVar8 + 1;
              puVar13 = puVar13 + 1;
            } while (puVar13 !=
                     local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
            if (local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              lVar17 = (long)local_128.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_128.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start;
              uVar9 = lVar17 >> 3;
              lVar22 = 0x3f;
              if (uVar9 != 0) {
                for (; uVar9 >> lVar22 == 0; lVar22 = lVar22 + -1) {
                }
              }
              __comp._M_comp.row = &local_1d0;
              __comp._M_comp.this = this;
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Disa::Matrix_Sparse::Matrix_Sparse(std::initializer_list<unsigned_long>,std::initializer_list<unsigned_long>,std::initializer_list<double>,unsigned_long)::__0>>
                        ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )local_128.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )local_128.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish,
                         (ulong)(((uint)lVar22 ^ 0x3f) * 2) ^ 0x7e,__comp);
              if (lVar17 < 0x81) {
                __comp_01._M_comp.row = &local_1d0;
                __comp_01._M_comp.this = this;
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<Disa::Matrix_Sparse::Matrix_Sparse(std::initializer_list<unsigned_long>,std::initializer_list<unsigned_long>,std::initializer_list<double>,unsigned_long)::__0>>
                          ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            )puVar7,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     )__last,__comp_01);
              }
              else {
                __last_00._M_current = puVar7 + 0x10;
                __comp_00._M_comp.row = &local_1d0;
                __comp_00._M_comp.this = this;
                std::
                __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<Disa::Matrix_Sparse::Matrix_Sparse(std::initializer_list<unsigned_long>,std::initializer_list<unsigned_long>,std::initializer_list<double>,unsigned_long)::__0>>
                          ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            )puVar7,__last_00,__comp_00);
                if (__last_00._M_current != __last) {
                  puVar7 = (this->row_non_zero).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  puVar13 = (this->column_index).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  do {
                    uVar19 = __last_00._M_current[-1];
                    uVar8 = *__last_00._M_current;
                    uVar4 = puVar7[local_1d0];
                    puVar20 = __last_00._M_current;
                    if (puVar13[uVar4 + uVar8] < puVar13[uVar4 + uVar19]) {
                      do {
                        *puVar20 = uVar19;
                        uVar19 = puVar20[-2];
                        uVar4 = puVar7[local_1d0];
                        puVar20 = puVar20 + -1;
                      } while (puVar13[uVar4 + uVar8] < puVar13[uVar4 + uVar19]);
                    }
                    *puVar20 = uVar8;
                    __last_00._M_current = __last_00._M_current + 1;
                  } while (__last_00._M_current != __last);
                }
              }
            }
          }
          __val = local_1d0;
          if (uVar3 != uVar2) {
            puVar7 = (this->row_non_zero).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            psVar10 = (source_location *)
                      (this->column_index).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar21 = (this->element_value).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            sVar16 = 0;
            do {
              lVar22 = (long)&((source_location *)
                              (local_128.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + sVar16))->_M_impl->
                              _M_file_name + puVar7[local_1d0];
              local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[sVar16] = pdVar21[lVar22];
              p_Var6 = psVar10[lVar22]._M_impl;
              ((source_location *)
              (local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + sVar16))->_M_impl = p_Var6;
              if ((__impl *)this->column_size <= p_Var6) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
                local_38 = &PTR_s__workspace_llm4binary_github_lic_0015dc60;
                console_format_abi_cxx11_(&local_1c8,(Disa *)0x0,(Log_Level)&local_38,psVar10);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_1c8._M_dataplus._M_p,
                                     local_1c8._M_string_length);
                std::__cxx11::to_string
                          (&local_98,
                           (unsigned_long)
                           ((source_location *)
                           (local_128.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start + sVar16))->_M_impl);
                std::operator+(&local_b8,"Column index, ",&local_98);
                pbVar12 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&local_b8,", in row ");
                local_148._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
                paVar14 = &pbVar12->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_148._M_dataplus._M_p == paVar14) {
                  local_148.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
                  local_148.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
                  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                }
                else {
                  local_148.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
                }
                local_148._M_string_length = pbVar12->_M_string_length;
                (pbVar12->_M_dataplus)._M_p = (pointer)paVar14;
                pbVar12->_M_string_length = 0;
                (pbVar12->field_2)._M_local_buf[0] = '\0';
                std::__cxx11::to_string(&local_58,__val);
                std::operator+(&local_108,&local_148,&local_58);
                pbVar12 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&local_108," not in range");
                local_188._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
                paVar14 = &pbVar12->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188._M_dataplus._M_p == paVar14) {
                  local_188.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
                  local_188.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
                  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                }
                else {
                  local_188.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
                }
                local_188._M_string_length = pbVar12->_M_string_length;
                (pbVar12->_M_dataplus)._M_p = (pointer)paVar14;
                pbVar12->_M_string_length = 0;
                (pbVar12->field_2)._M_local_buf[0] = '\0';
                range_column_abi_cxx11_(&local_78,this);
                std::operator+(&local_168,&local_188,&local_78);
                pbVar12 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&local_168,".");
                local_1a8._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
                paVar14 = &pbVar12->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_dataplus._M_p == paVar14) {
                  local_1a8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
                  local_1a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
                  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                }
                else {
                  local_1a8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
                }
                local_1a8._M_string_length = pbVar12->_M_string_length;
                (pbVar12->_M_dataplus)._M_p = (pointer)paVar14;
                pbVar12->_M_string_length = 0;
                (pbVar12->field_2)._M_local_buf[0] = '\0';
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
                std::endl<char,std::char_traits<char>>(poVar11);
                std::__cxx11::string::~string((string *)&local_1a8);
                std::__cxx11::string::~string((string *)&local_168);
                std::__cxx11::string::~string((string *)&local_78);
                std::__cxx11::string::~string((string *)&local_188);
                std::__cxx11::string::~string((string *)&local_108);
                std::__cxx11::string::~string((string *)&local_58);
                std::__cxx11::string::~string((string *)&local_148);
                std::__cxx11::string::~string((string *)&local_b8);
                this_00 = &local_98;
                goto LAB_0013ce92;
              }
              sVar16 = sVar16 + 1;
            } while (__new_size != sVar16);
          }
          psVar15 = (source_location *)
                    local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          psVar10 = (source_location *)
                    local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            do {
              psVar18 = psVar10 + 1;
              psVar15 = (source_location *)
                        local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              if (psVar18 ==
                  (source_location *)
                  local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish) break;
              pp_Var5 = &psVar10->_M_impl;
              psVar15 = psVar10;
              psVar10 = psVar18;
            } while (*pp_Var5 != psVar18->_M_impl);
          }
          if (psVar15 !=
              (source_location *)
              local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            psVar10 = (source_location *)
                      local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
            local_98._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_0015dc78;
            console_format_abi_cxx11_(&local_1c8,(Disa *)0x0,(Log_Level)&local_98,psVar10);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,local_1c8._M_dataplus._M_p,
                                 local_1c8._M_string_length);
            std::__cxx11::to_string(&local_148,this->column_size);
            std::operator+(&local_108,"Duplicate column index, ",&local_148);
            pbVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                (&local_108,"in row ");
            local_188._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
            paVar14 = &pbVar12->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p == paVar14) {
              local_188.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
              local_188.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
              local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            }
            else {
              local_188.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            }
            local_188._M_string_length = pbVar12->_M_string_length;
            (pbVar12->_M_dataplus)._M_p = (pointer)paVar14;
            pbVar12->_M_string_length = 0;
            (pbVar12->field_2)._M_local_buf[0] = '\0';
            std::__cxx11::to_string(&local_b8,local_1d0);
            std::operator+(&local_168,&local_188,&local_b8);
            pbVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                (&local_168,".");
            local_1a8._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
            paVar14 = &pbVar12->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p == paVar14) {
              local_1a8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
              local_1a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            }
            else {
              local_1a8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            }
            local_1a8._M_string_length = pbVar12->_M_string_length;
            (pbVar12->_M_dataplus)._M_p = (pointer)paVar14;
            pbVar12->_M_string_length = 0;
            (pbVar12->field_2)._M_local_buf[0] = '\0';
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
            std::endl<char,std::char_traits<char>>(poVar11);
            std::__cxx11::string::~string((string *)&local_1a8);
            std::__cxx11::string::~string((string *)&local_168);
            std::__cxx11::string::~string((string *)&local_b8);
            std::__cxx11::string::~string((string *)&local_188);
            std::__cxx11::string::~string((string *)&local_108);
            this_00 = &local_148;
            goto LAB_0013ce92;
          }
          uVar2 = (this->row_non_zero).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[local_1d0];
          if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pdVar23 = (local_c8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start + uVar2;
            pdVar21 = local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            do {
              dVar1 = *pdVar21;
              *pdVar21 = *pdVar23;
              *pdVar23 = dVar1;
              pdVar21 = pdVar21 + 1;
              pdVar23 = pdVar23 + 1;
            } while (pdVar21 !=
                     local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          }
          if (local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            puVar7 = (local_c0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start + uVar2;
            psVar10 = (source_location *)
                      local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              p_Var6 = psVar10->_M_impl;
              psVar10->_M_impl = (__impl *)*puVar7;
              *puVar7 = (unsigned_long)p_Var6;
              psVar10 = psVar10 + 1;
              puVar7 = puVar7 + 1;
            } while (psVar10 !=
                     (source_location *)
                     local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
          }
          local_1d0 = local_1d0 + 1;
          puVar7 = (this->row_non_zero).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (local_1d0 <
                 ((long)(this->row_non_zero).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar7 >> 3) - 1U);
      }
      if ((source_location *)
          local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (source_location *)0x0) {
        operator_delete(local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_128.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_b8._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_0015dc48;
    console_format_abi_cxx11_(&local_1c8,(Disa *)0x0,(Log_Level)&local_b8,psVar15);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_1c8._M_dataplus._M_p,local_1c8._M_string_length
                        );
    std::__cxx11::to_string
              (&local_108,
               (long)(this->column_index).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->column_index).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3);
    std::operator+(&local_188,"Mis-match in column and value size, ",&local_108);
    pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_188," vs. ");
    local_168._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
    paVar14 = &pbVar12->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p == paVar14) {
      local_168.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_168.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    }
    else {
      local_168.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_168._M_string_length = pbVar12->_M_string_length;
    (pbVar12->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar12->_M_string_length = 0;
    (pbVar12->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::to_string(&local_148,value._M_len);
    std::operator+(&local_1a8,&local_168,&local_148);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
    std::endl<char,std::char_traits<char>>(poVar11);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    this_00 = &local_108;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_108._M_dataplus._M_p = (pointer)&PTR_s__workspace_llm4binary_github_lic_0015dc00;
    console_format_abi_cxx11_
              (&local_1c8,(Disa *)0x0,(Log_Level)&local_108,(source_location *)pbVar12);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_1c8._M_dataplus._M_p,local_1c8._M_string_length
                        );
    std::__cxx11::to_string
              (&local_188,
               *(this->row_non_zero).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start);
    std::operator+(&local_168,"First value must be zero, but is ",&local_188);
    pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_168,".");
    local_1a8._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
    paVar14 = &pbVar12->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p == paVar14) {
      local_1a8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_1a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    }
    else {
      local_1a8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_1a8._M_string_length = pbVar12->_M_string_length;
    (pbVar12->_M_dataplus)._M_p = (pointer)paVar14;
    pbVar12->_M_string_length = 0;
    (pbVar12->field_2)._M_local_buf[0] = '\0';
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
    std::endl<char,std::char_traits<char>>(poVar11);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_168);
    this_00 = &local_188;
  }
LAB_0013ce92:
  std::__cxx11::string::~string((string *)this_00);
LAB_0013ce97:
  std::__cxx11::string::~string((string *)&local_1c8);
  exit(1);
}

Assistant:

Matrix_Sparse::Matrix_Sparse(std::initializer_list<std::size_t> non_zero, std::initializer_list<std::size_t> index,
                             std::initializer_list<double> value, std::size_t column)
    : row_non_zero(non_zero), column_index(index), element_value(value), column_size(column) {
  ASSERT(row_non_zero.front() == 0, "First value must be zero, but is " + std::to_string(row_non_zero.front()) + ".");
  ASSERT(row_non_zero.back() == column_index.size(), "Number of non-zeros does not match number of column non zeros");
  ASSERT(std::is_sorted(row_non_zero.begin(), row_non_zero.end()), "Inconsistent non-zeros list, but be ascending.");
  ASSERT(column_index.size() == value.size(), "Mis-match in column and value size, " +
                                              std::to_string(column_index.size()) + " vs. " +
                                              std::to_string(value.size()));

  std::vector<double> new_value;
  std::vector<std::size_t> org_index;
  FOR(row, row_non_zero.size() - 1) {
    const std::size_t size_non_zero = row_non_zero[row + 1] - row_non_zero[row];
    org_index.resize(size_non_zero);
    new_value.resize(size_non_zero);
    std::iota(org_index.begin(), org_index.end(), 0);
    std::sort(org_index.begin(), org_index.end(), [&](const std::size_t index_0, const std::size_t index_1) {
      return column_index[row_non_zero[row] + index_0] < column_index[row_non_zero[row] + index_1];
    });

    FOR(i_non_zero, size_non_zero) {
      new_value[i_non_zero] = element_value[row_non_zero[row] + org_index[i_non_zero]];
      org_index[i_non_zero] = column_index[row_non_zero[row] + org_index[i_non_zero]];
      ASSERT(org_index[i_non_zero] < column_size, "Column index, " + std::to_string(org_index[i_non_zero]) +
                                                  ", in row " + std::to_string(row) + " not in range" + range_column() +
                                                  ".");
    }
    ASSERT(std::adjacent_find(org_index.begin(), org_index.end()) == org_index.end(),
           "Duplicate column index, " + std::to_string(column_size) + "in row " + std::to_string(row) + ".");
    std::swap_ranges(new_value.begin(), new_value.end(),
                     std::next(element_value.begin(), static_cast<s_size_t>(row_non_zero[row])));
    std::swap_ranges(org_index.begin(), org_index.end(),
                     std::next(column_index.begin(), static_cast<s_size_t>(row_non_zero[row])));
  }
}